

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O0

void_handler_t * make_print_message(void_handler_t *__return_storage_ptr__,string *msg)

{
  string local_38 [32];
  string *local_18;
  string *msg_local;
  
  local_18 = msg;
  msg_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string(local_38,(string *)msg);
  std::function<void(std::__cxx11::string_const&)>::
  function<make_print_message(std::__cxx11::string)::__0,void>
            ((function<void(std::__cxx11::string_const&)> *)__return_storage_ptr__,
             (anon_class_32_1_ba1d62e1 *)local_38);
  make_print_message(std::__cxx11::string)::$_0::~__0((__0 *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static JSONHandler::void_handler_t
make_print_message(std::string msg)
{
    return [msg](std::string const& path) { std::cout << path << ": json: " << msg << std::endl; };
}